

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O1

double sptk::world::randn(RandnState *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar1 = state->g_randn_x << 0xb ^ state->g_randn_x;
  uVar5._0_4_ = state->g_randn_y;
  uVar5._4_4_ = state->g_randn_z;
  state->g_randn_x = (undefined4)uVar5;
  state->g_randn_y = uVar5._4_4_;
  uVar3 = state->g_randn_w;
  state->g_randn_z = uVar3;
  uVar1 = uVar1 >> 8 ^ uVar3 >> 0x13 ^ uVar1 ^ uVar3;
  state->g_randn_w = uVar1;
  uVar4 = uVar1 >> 4;
  iVar7 = 0xb;
  uVar8 = state->g_randn_y;
  do {
    uVar6 = uVar8;
    uVar2 = uVar1;
    uVar8 = uVar3;
    uVar3 = (uint)uVar5 << 0xb ^ (uint)uVar5;
    uVar1 = uVar3 >> 8 ^ uVar2 >> 0x13 ^ uVar3 ^ uVar2;
    uVar4 = uVar4 + (uVar1 >> 4);
    uVar5 = (ulong)uVar6;
    iVar7 = iVar7 + -1;
    uVar3 = uVar2;
  } while (iVar7 != 0);
  state->g_randn_x = uVar6;
  state->g_randn_y = uVar8;
  state->g_randn_z = uVar2;
  state->g_randn_w = uVar1;
  return (double)uVar4 * 3.725290298461914e-09 + -6.0;
}

Assistant:

double randn(RandnState *state) {
  uint32_t t;
  t = state->g_randn_x ^ (state->g_randn_x << 11);
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w
    = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));

  uint32_t tmp = state->g_randn_w >> 4;
  for (int i = 0; i < 11; ++i) {
    t = state->g_randn_x ^ (state->g_randn_x << 11);
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w
      = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));
    tmp += state->g_randn_w >> 4;
  }
  return tmp / 268435456.0 - 6.0;
}